

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O0

void beltCHEStepE(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_che_st *st;
  ulong local_10;
  ulong *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x26) != 0) {
    if (in_RSI <= *(ulong *)(in_RDX + 0x26)) {
      memXor2(in_RDI,(void *)((long)in_RDX + (0x90 - *(long *)(in_RDX + 0x26))),in_RSI);
      *(ulong *)(in_RDX + 0x26) = *(long *)(in_RDX + 0x26) - in_RSI;
      return;
    }
    memXor2(in_RDI,(void *)((long)in_RDX + (0x90 - *(long *)(in_RDX + 0x26))),
            *(size_t *)(in_RDX + 0x26));
    local_10 = in_RSI - *(long *)(in_RDX + 0x26);
    local_8 = (ulong *)((long)in_RDI + *(long *)(in_RDX + 0x26));
    in_RDX[0x26] = 0;
    in_RDX[0x27] = 0;
  }
  for (; 0xf < local_10; local_10 = local_10 - 0x10) {
    beltBlockMulC(in_RDX + 8);
    in_RDX[8] = in_RDX[8] ^ 1;
    *(undefined8 *)(in_RDX + 0x20) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)(in_RDX + 0x22) = *(undefined8 *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 0x20,in_RDX);
    *local_8 = *(ulong *)(in_RDX + 0x20) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 0x22) ^ local_8[1];
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    beltBlockMulC(in_RDX + 8);
    in_RDX[8] = in_RDX[8] ^ 1;
    *(undefined8 *)(in_RDX + 0x20) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)(in_RDX + 0x22) = *(undefined8 *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 0x20,in_RDX);
    memXor2(local_8,in_RDX + 0x20,local_10);
    *(ulong *)(in_RDX + 0x26) = 0x10 - local_10;
  }
  return;
}

Assistant:

void beltCHEStepE(void* buf, size_t count, void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCHE_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block1 + 16 - st->reserved, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block1 + 16 - st->reserved, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockMulC(st->s), st->s[0] ^= 0x00000001;
		beltBlockCopy(st->block1, st->s);
		beltBlockEncr2((u32*)st->block1, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block1);
#endif
		beltBlockXor2(buf, st->block1);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockMulC(st->s), st->s[0] ^= 0x00000001;
		beltBlockCopy(st->block1, st->s);
		beltBlockEncr2((u32*)st->block1, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block1);
#endif
		memXor2(buf, st->block1, count);
		st->reserved = 16 - count;
	}
}